

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

matrix3d * tinyusdz::to_matrix3x3(matrix3d *__return_storage_ptr__,quatf *q)

{
  undefined8 uVar1;
  long lVar2;
  double *pdVar3;
  matrix3d *pmVar4;
  byte bVar5;
  double3x3 m33;
  vec<double,_4> local_78;
  double local_58 [9];
  
  bVar5 = 0;
  uVar1 = *(undefined8 *)(q->imag)._M_elems;
  local_78.x = (double)(float)uVar1;
  local_78.y = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)((q->imag)._M_elems + 2);
  local_78.z = (double)(float)uVar1;
  local_78.w = (double)(float)((ulong)uVar1 >> 0x20);
  linalg::qmat<double>(&local_78);
  pdVar3 = local_58;
  pmVar4 = __return_storage_ptr__;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    pmVar4->m[0][0] = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pmVar4 = (matrix3d *)((long)pmVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d to_matrix3x3(const value::quatf &q) {
  double3x3 m33 = linalg::qmat<double>({double(q.imag[0]), double(q.imag[1]),
                                        double(q.imag[2]), double(q.real)});

  value::matrix3d m;
  Identity(&m);

  memcpy(m.m, &m33[0][0], sizeof(double) * 3 * 3);

  return m;
}